

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::OptionNotFound::OptionNotFound(OptionNotFound *this,string *msg,ExitCodes exit_code)

{
  string local_78;
  allocator local_41;
  string local_40;
  ExitCodes local_1c;
  string *psStack_18;
  ExitCodes exit_code_local;
  string *msg_local;
  OptionNotFound *this_local;
  
  local_1c = exit_code;
  psStack_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"OptionNotFound",&local_41);
  ::std::__cxx11::string::string((string *)&local_78,(string *)msg);
  Error::Error(&this->super_Error,&local_40,&local_78,local_1c);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined ***)&this->super_Error = &PTR__OptionNotFound_0017f608;
  return;
}

Assistant:

explicit OptionNotFound(std::string name) : OptionNotFound(name + " not found", ExitCodes::OptionNotFound) {}